

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O3

ze_result_t loader::zesMemoryGetState(zes_mem_handle_t hMemory,zes_mem_state_t *pState)

{
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hMemory + 8) + 0xbc8) != (code *)0x0) {
    zVar1 = (**(code **)(*(long *)(hMemory + 8) + 0xbc8))(*(undefined8 *)hMemory);
    return zVar1;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesMemoryGetState(
        zes_mem_handle_t hMemory,                       ///< [in] Handle for the component.
        zes_mem_state_t* pState                         ///< [in,out] Will contain the current health and allocated memory.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_mem_object_t*>( hMemory )->dditable;
        auto pfnGetState = dditable->zes.Memory.pfnGetState;
        if( nullptr == pfnGetState )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMemory = reinterpret_cast<zes_mem_object_t*>( hMemory )->handle;

        // forward to device-driver
        result = pfnGetState( hMemory, pState );

        return result;
    }